

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::GeoParquetFileMetadata::CreateColumnReader
          (GeoParquetFileMetadata *this,ParquetReader *reader,ParquetColumnSchema *schema,
          ClientContext *context)

{
  ScalarFunctionCatalogEntry *pSVar1;
  mapped_type *pmVar2;
  Catalog *this_00;
  const_reference pvVar3;
  BoundReferenceExpression *this_01;
  ExpressionColumnReader *this_02;
  NotImplementedException *this_03;
  ClientContext *in_R8;
  vector<duckdb::ParquetColumnSchema,_true> *this_04;
  initializer_list<duckdb::LogicalType> __l;
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> entry;
  ScalarFunction conversion_func;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  undefined1 local_1a8 [16];
  string local_198;
  ScalarFunctionCatalogEntry *local_178;
  element_type *peStack_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  ParquetReader *local_160;
  undefined1 local_158 [176];
  undefined1 local_a8 [16];
  ResizeableBuffer *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_160 = (ParquetReader *)schema;
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(reader->super_BaseFileReader).column_ids.column_ids.
                            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            .
                            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (key_type *)
                        &(context->super_enable_shared_from_this<duckdb::ClientContext>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  this_00 = Catalog::GetSystemCatalog(in_R8);
  this_04 = (vector<duckdb::ParquetColumnSchema,_true> *)
            ((long)&(context->config).profiler_save_location.field_2 + 8);
  pvVar3 = vector<duckdb::ParquetColumnSchema,_true>::operator[](this_04,0);
  if (((pvVar3->type).id_ == BLOB) && (pmVar2->geometry_encoding == WKB)) {
    local_158._0_8_ = local_158 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"main","");
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"st_geomfromwkb","");
    local_178 = (ScalarFunctionCatalogEntry *)
                Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                          (this_00,in_R8,(string *)local_158,&local_198,THROW_EXCEPTION,
                           (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> *)&local_178);
    pSVar1 = local_178;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
    LogicalType::LogicalType((LogicalType *)&local_178,BLOB);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_178;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198,__l,
               (allocator_type *)&local_1b0);
    ScalarFunctionSet::GetFunctionByArguments
              ((ScalarFunction *)local_158,&pSVar1->functions,in_R8,
               (vector<duckdb::LogicalType,_true> *)&local_198);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198);
    LogicalType::~LogicalType((LogicalType *)&local_178);
    local_178 = (ScalarFunctionCatalogEntry *)0x0;
    peStack_170 = (element_type *)0x0;
    local_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (BoundReferenceExpression *)operator_new(0x60);
    LogicalType::LogicalType((LogicalType *)&local_198,BLOB);
    BoundReferenceExpression::BoundReferenceExpression(this_01,(LogicalType *)&local_198,0);
    LogicalType::~LogicalType((LogicalType *)&local_198);
    local_1b0._M_head_impl = (Expression *)this_01;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_178,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b0);
    if ((BoundReferenceExpression *)local_1b0._M_head_impl != (BoundReferenceExpression *)0x0) {
      (*(((Expression *)&(local_1b0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_198._M_dataplus._M_p = (pointer)0x0;
    make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
              ((LogicalType *)(local_1a8 + 8),(ScalarFunction *)(local_158 + 0x90),
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_158,&local_178);
    pvVar3 = vector<duckdb::ParquetColumnSchema,_true>::operator[](this_04,0);
    ColumnReader::CreateReader((ColumnReader *)local_1a8,local_160,pvVar3);
    this_02 = (ExpressionColumnReader *)operator_new(0x298);
    local_1b0._M_head_impl = (Expression *)local_1a8._8_8_;
    local_198._M_dataplus._M_p = (pointer)local_1a8._0_8_;
    local_1a8._0_8_ = (_func_int **)0x0;
    local_1a8._8_8_ = (ParquetColumnSchema *)0x0;
    ExpressionColumnReader::ExpressionColumnReader
              (this_02,in_R8,
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               &local_198,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b0);
    if (local_1b0._M_head_impl != (Expression *)0x0) {
      (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1b0._M_head_impl = (Expression *)0x0;
    if ((long *)local_198._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))();
    }
    *(ExpressionColumnReader **)&(this->write_lock).super___mutex_base._M_mutex = this_02;
    if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_1a8._0_8_ + 8))();
    }
    if ((ParquetColumnSchema *)local_1a8._8_8_ != (ParquetColumnSchema *)0x0) {
      (**(code **)(*(long *)local_1a8._8_8_ + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_178);
    local_158._0_8_ = &PTR__ScalarFunction_02432a00;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (local_98 != (ResizeableBuffer *)0x0) {
      (*(code *)local_98)(local_a8,local_a8,3);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
    return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
           (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
  }
  this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_158._0_8_ = local_158 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,"Unsupported geometry encoding","");
  NotImplementedException::NotImplementedException(this_03,(string *)local_158);
  __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnReader> GeoParquetFileMetadata::CreateColumnReader(ParquetReader &reader,
                                                                    const ParquetColumnSchema &schema,
                                                                    ClientContext &context) {

	D_ASSERT(IsGeometryColumn(schema.name));

	const auto &column = geometry_columns[schema.name];

	// Get the catalog
	auto &catalog = Catalog::GetSystemCatalog(context);

	// WKB encoding
	if (schema.children[0].type.id() == LogicalTypeId::BLOB &&
	    column.geometry_encoding == GeoParquetColumnEncoding::WKB) {
		// Look for a conversion function in the catalog
		auto &conversion_func_set =
		    catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, "st_geomfromwkb");
		auto conversion_func = conversion_func_set.functions.GetFunctionByArguments(context, {LogicalType::BLOB});

		// Create a bound function call expression
		auto args = vector<unique_ptr<Expression>>();
		args.push_back(std::move(make_uniq<BoundReferenceExpression>(LogicalType::BLOB, 0)));
		auto expr =
		    make_uniq<BoundFunctionExpression>(conversion_func.return_type, conversion_func, std::move(args), nullptr);

		// Create a child reader
		auto child_reader = ColumnReader::CreateReader(reader, schema.children[0]);

		// Create an expression reader that applies the conversion function to the child reader
		return make_uniq<ExpressionColumnReader>(context, std::move(child_reader), std::move(expr));
	}

	// Otherwise, unrecognized encoding
	throw NotImplementedException("Unsupported geometry encoding");
}